

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_order_segments(REF_INT n,REF_INT *c2n,REF_INT *order)

{
  ulong uVar1;
  REF_STATUS RVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  RVar2 = 0;
  if (n != 0) {
    if (n < 1) {
      *order = 0;
    }
    else {
      uVar1 = (ulong)(uint)n;
      uVar6 = 0;
      do {
        uVar5 = 0;
        while (c2n[uVar6 * 2] != c2n[uVar5 * 2 + 1]) {
          uVar5 = uVar5 + 1;
          if (uVar1 == uVar5) goto LAB_0014a677;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
      uVar6 = 0xffffffff;
LAB_0014a677:
      iVar3 = (int)uVar6;
      iVar4 = iVar3;
      if (iVar3 == -1) {
        iVar4 = 0;
      }
      *order = iVar4;
      if (n != 1) {
        uVar6 = 1;
        do {
          uVar5 = 0;
          while (c2n[(long)order[uVar6 - 1] * 2 + 1] != c2n[uVar5 * 2]) {
            uVar5 = uVar5 + 1;
            if (uVar1 == uVar5) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0xb03,"ref_export_order_segments","next segment not found");
              goto LAB_0014a746;
            }
          }
          order[uVar6] = (REF_INT)uVar5;
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar1);
      }
      if (iVar3 != -1) {
        return 0;
      }
    }
    RVar2 = 0;
    if (*c2n != c2n[(long)order[(long)n + -1] * 2 + 1]) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xb08,"ref_export_order_segments","first and last do not match for loop",(long)*c2n,
             (long)c2n[(long)order[(long)n + -1] * 2 + 1]);
LAB_0014a746:
      RVar2 = 1;
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_export_order_segments(REF_INT n, REF_INT *c2n,
                                             REF_INT *order) {
  REF_INT i, j, first_cell;
  REF_BOOL found, loop;

  if (0 == n) return REF_SUCCESS;

  first_cell = REF_EMPTY;
  for (i = 0; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[0 + 2 * i] == c2n[1 + 2 * j]) {
        found = REF_TRUE;
        break;
      }
    }
    if (!found) {
      first_cell = i;
      break;
    }
  }

  /* arbitrary for loops */
  loop = REF_FALSE;
  if (REF_EMPTY == first_cell) {
    loop = REF_TRUE;
    first_cell = 0;
  }

  order[0] = first_cell;
  for (i = 1; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[1 + 2 * order[i - 1]] == c2n[0 + 2 * j]) {
        order[i] = j;
        found = REF_TRUE;
        break;
      }
    }
    RAS(found, "next segment not found");
  }

  if (loop)
    REIS(c2n[0 + 2 * order[0]], c2n[1 + 2 * order[n - 1]],
         "first and last do not match for loop");

  return REF_SUCCESS;
}